

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O0

Status leveldb::ReadFileToString(Env *env,string *fname,string *data)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  Status *in_RDI;
  Slice fragment;
  char *space;
  SequentialFile *file;
  Status *s;
  Status *in_stack_ffffffffffffff78;
  Status *in_stack_ffffffffffffff80;
  undefined1 local_50 [8];
  Slice local_48;
  void *local_38;
  undefined1 local_29;
  long *local_28;
  char *local_20;
  undefined8 local_18;
  long *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::clear();
  local_29 = 0;
  (**(code **)(*local_10 + 0x10))(in_RDI,local_10,local_18,&local_28);
  bVar2 = Status::ok(in_RDI);
  if (bVar2) {
    local_38 = operator_new__(0x2000);
    do {
      Slice::Slice(&local_48);
      (**(code **)(*local_28 + 0x10))(local_50,local_28,0x2000,&local_48,local_38);
      Status::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      Status::~Status(in_stack_ffffffffffffff80);
      bVar2 = Status::ok(in_RDI);
      pcVar1 = local_20;
      if (!bVar2) break;
      pcVar3 = Slice::data(&local_48);
      Slice::size(&local_48);
      std::__cxx11::string::append(pcVar1,(ulong)pcVar3);
      bVar2 = Slice::empty(&local_48);
    } while (!bVar2);
    if (local_38 != (void *)0x0) {
      operator_delete__(local_38);
    }
    if (local_28 != (long *)0x0) {
      (**(code **)(*local_28 + 8))();
    }
  }
  return (Status)(char *)in_RDI;
}

Assistant:

Status ReadFileToString(Env* env, const std::string& fname, std::string* data) {
  data->clear();
  SequentialFile* file;
  Status s = env->NewSequentialFile(fname, &file);
  if (!s.ok()) {
    return s;
  }
  static const int kBufferSize = 8192;
  char* space = new char[kBufferSize];
  while (true) {
    Slice fragment;
    s = file->Read(kBufferSize, &fragment, space);
    if (!s.ok()) {
      break;
    }
    data->append(fragment.data(), fragment.size());
    if (fragment.empty()) {
      break;
    }
  }
  delete[] space;
  delete file;
  return s;
}